

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decPrint.c
# Opt level: O3

void Dec_GraphPrint2_rec(FILE *pFile,Dec_Graph_t *pGraph,Dec_Node_t *pNode,int fCompl,
                        char **pNamesIn,int *pPos,int LitSizeMax)

{
  Dec_Node_t *pNode_00;
  uint uVar1;
  Dec_Node_t *pDVar2;
  int iVar3;
  int in_stack_ffffffffffffffb8;
  
  pDVar2 = pGraph->pNodes;
  iVar3 = (int)((ulong)((long)pNode - (long)pDVar2) >> 3) * -0x55555555;
  if (iVar3 < pGraph->nLeaves) {
    iVar3 = Dec_GraphPrintGetLeafName(pFile,iVar3,fCompl,pNamesIn);
    *pPos = *pPos + iVar3;
    return;
  }
  pNode_00 = pDVar2 + ((uint)pNode->eEdge0 >> 1 & 0x3fffffff);
  pDVar2 = pDVar2 + ((uint)pNode->eEdge1 >> 1 & 0x3fffffff);
  uVar1 = *(uint *)&pNode->field_0x10;
  if ((uVar1 >> 0xe & 1) == 0) {
    if ((pNode_00->field_0x11 & 0x40) == 0) {
      Dec_GraphPrint_rec(pFile,pGraph,pNode_00,uVar1 >> 0xf & 1,pNamesIn,pPos,
                         in_stack_ffffffffffffffb8);
    }
    else {
      fputc(0x28,(FILE *)pFile);
      *pPos = *pPos + 1;
      Dec_GraphPrint_rec(pFile,pGraph,pNode_00,*(uint *)&pNode->field_0x10 >> 0xf & 1,pNamesIn,pPos,
                         in_stack_ffffffffffffffb8);
      fputc(0x29,(FILE *)pFile);
      *pPos = *pPos + 1;
    }
    fputc(0x20,(FILE *)pFile);
    *pPos = *pPos + 1;
    Dec_GraphPrintUpdatePos(pFile,pPos,LitSizeMax);
    if ((pDVar2->field_0x11 & 0x40) != 0) {
      fputc(0x28,(FILE *)pFile);
      *pPos = *pPos + 1;
      Dec_GraphPrint_rec(pFile,pGraph,pDVar2,*(uint *)&pNode->field_0x10 >> 0x10 & 1,pNamesIn,pPos,
                         in_stack_ffffffffffffffb8);
      fputc(0x29,(FILE *)pFile);
      *pPos = *pPos + 1;
      return;
    }
  }
  else {
    Dec_GraphPrint_rec(pFile,pGraph,pNode_00,uVar1 >> 0xf & 1,pNamesIn,pPos,
                       in_stack_ffffffffffffffb8);
    fwrite(" + ",3,1,(FILE *)pFile);
    *pPos = *pPos + 3;
    Dec_GraphPrintUpdatePos(pFile,pPos,LitSizeMax);
  }
  Dec_GraphPrint_rec(pFile,pGraph,pDVar2,*(uint *)&pNode->field_0x10 >> 0x10 & 1,pNamesIn,pPos,
                     LitSizeMax);
  return;
}

Assistant:

void Dec_GraphPrint2_rec( FILE * pFile, Dec_Graph_t * pGraph, Dec_Node_t * pNode, int fCompl, char * pNamesIn[], int * pPos, int LitSizeMax )
{
    Dec_Node_t * pNode0, * pNode1;
    pNode0 = Dec_GraphNode(pGraph, pNode->eEdge0.Node);
    pNode1 = Dec_GraphNode(pGraph, pNode->eEdge1.Node);
    if ( Dec_GraphNodeIsVar(pGraph, pNode) ) // FT_NODE_LEAF )
    {
        (*pPos) += Dec_GraphPrintGetLeafName( pFile, Dec_GraphNodeInt(pGraph,pNode), fCompl, pNamesIn );
        return;
    }
    if ( !pNode->fNodeOr ) // FT_NODE_AND )
    {
        if ( !pNode0->fNodeOr ) // != FT_NODE_OR )
            Dec_GraphPrint_rec( pFile, pGraph, pNode0, pNode->fCompl0, pNamesIn, pPos, LitSizeMax );
        else
        {
            fprintf( pFile, "(" );
            (*pPos)++;
            Dec_GraphPrint_rec( pFile, pGraph, pNode0, pNode->fCompl0, pNamesIn, pPos, LitSizeMax );
            fprintf( pFile, ")" );
            (*pPos)++;
        }
        fprintf( pFile, " " );
        (*pPos)++;

        Dec_GraphPrintUpdatePos( pFile, pPos, LitSizeMax );

        if ( !pNode1->fNodeOr ) // != FT_NODE_OR )
            Dec_GraphPrint_rec( pFile, pGraph, pNode1, pNode->fCompl1, pNamesIn, pPos, LitSizeMax );
        else
        {
            fprintf( pFile, "(" );
            (*pPos)++;
            Dec_GraphPrint_rec( pFile, pGraph, pNode1, pNode->fCompl1, pNamesIn, pPos, LitSizeMax );
            fprintf( pFile, ")" );
            (*pPos)++;
        }
        return;
    }
    if ( pNode->fNodeOr ) // FT_NODE_OR )
    {
        Dec_GraphPrint_rec( pFile, pGraph, pNode0, pNode->fCompl0, pNamesIn, pPos, LitSizeMax );
        fprintf( pFile, " + " );
        (*pPos) += 3;

        Dec_GraphPrintUpdatePos( pFile, pPos, LitSizeMax );

        Dec_GraphPrint_rec( pFile, pGraph, pNode1, pNode->fCompl1, pNamesIn, pPos, LitSizeMax );
        return;
    }
    assert( 0 );
}